

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-utils.h
# Opt level: O0

double tour_profit(Instance *instance,Tour *tour)

{
  int iVar1;
  int32_t *piVar2;
  int32_t local_24;
  int32_t next_vertex;
  int32_t curr_vertex;
  double profit;
  Tour *tour_local;
  Instance *instance_local;
  
  _next_vertex = 0.0;
  piVar2 = tcomp(tour,0);
  if (-1 < *piVar2) {
    local_24 = 0;
    _next_vertex = *instance->profits + 0.0;
    while( true ) {
      piVar2 = tsucc(tour,local_24);
      iVar1 = *piVar2;
      if (iVar1 == 0) break;
      if (iVar1 < 0) {
        __assert_fail("next_vertex >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                      ,0xa9,"double tour_profit(const Instance *, Tour *)");
      }
      if (iVar1 == local_24) {
        __assert_fail("next_vertex != curr_vertex",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                      ,0xaa,"double tour_profit(const Instance *, Tour *)");
      }
      _next_vertex = instance->profits[iVar1] + _next_vertex;
      local_24 = iVar1;
    }
  }
  return _next_vertex;
}

Assistant:

static inline double tour_profit(const Instance *instance, Tour *tour) {
    double profit = 0.0;
    if (*tcomp(tour, 0) >= 0) {
        int32_t curr_vertex = 0;
        int32_t next_vertex = -1;
        profit += instance->profits[0];

        while ((next_vertex = *tsucc(tour, curr_vertex)) != 0) {
            assert(next_vertex >= 0);
            assert(next_vertex != curr_vertex);
            profit += instance->profits[next_vertex];
            curr_vertex = next_vertex;
        }
    }
    return profit;
}